

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

LockNode * __thiscall GraphBuilder::addNode<LockNode>(GraphBuilder *this,LockNode *node)

{
  bool bVar1;
  LockNode *in_RSI;
  LockNode **in_RDI;
  pair<std::__detail::_Node_iterator<Node_*,_true,_false>,_bool> pVar2;
  Node *in_stack_ffffffffffffff68;
  LockNode **__x;
  unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
  *in_stack_ffffffffffffff80;
  LockNode *local_8;
  
  __x = in_RDI + 0x2b;
  Node::callInstruction(in_stack_ffffffffffffff68);
  std::
  unordered_map<llvm::CallInst_const*,LockNode*,std::hash<llvm::CallInst_const*>,std::equal_to<llvm::CallInst_const*>,std::allocator<std::pair<llvm::CallInst_const*const,LockNode*>>>
  ::emplace<llvm::CallInst_const*,LockNode*&>
            ((unordered_map<const_llvm::CallInst_*,_LockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_LockNode_*>_>_>
              *)in_stack_ffffffffffffff80,(CallInst **)__x,in_RDI);
  bVar1 = Node::isArtificial(&in_RSI->super_Node);
  if (bVar1) {
    pVar2 = std::
            unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
            ::insert((unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
                      *)in_stack_ffffffffffffff80,(value_type *)__x);
  }
  else {
    Node::llvmInstruction(&in_RSI->super_Node);
    pVar2 = (pair<std::__detail::_Node_iterator<Node_*,_true,_false>,_bool>)
            std::
            unordered_map<llvm::Instruction_const*,Node*,std::hash<llvm::Instruction_const*>,std::equal_to<llvm::Instruction_const*>,std::allocator<std::pair<llvm::Instruction_const*const,Node*>>>
            ::emplace<llvm::Instruction_const*,LockNode*&>
                      (in_stack_ffffffffffffff80,(Instruction **)__x,in_RDI);
  }
  local_8 = in_RSI;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_8 = (LockNode *)0x0;
  }
  return local_8;
}

Assistant:

LockNode *GraphBuilder::addNode(LockNode *node) {
    llvmToLocks_.emplace(node->callInstruction(), node);
    if (node->isArtificial()) {
        if (this->artificialNodes_.insert(node).second) {
            return node;
        }
    } else {
        if (this->llvmToNodeMap_.emplace(node->llvmInstruction(), node)
                    .second) {
            return node;
        }
    }

    return nullptr;
}